

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O2

SFFile * ReadSF2(char *filename,FileReader *f)

{
  uint uVar1;
  bool bVar2;
  DWORD DVar3;
  DWORD DVar4;
  SFFile *this;
  undefined8 uVar5;
  DWORD chunklen;
  FString local_30;
  
  DVar3 = read_id(f);
  if (DVar3 == 0x46464952) {
    DVar3 = read_dword(f);
    DVar4 = read_id(f);
    if (DVar4 == 0x6b626673) {
      check_list(f,0x4f464e49,DVar3 - 4,&chunklen);
      this = (SFFile *)operator_new(0x90);
      FString::FString(&local_30,filename);
      SFFile::SFFile(this,&local_30);
      FString::~FString(&local_30);
      DVar4 = chunklen;
      this->MinorVersion = -1;
      ParseLIST(this,f,chunklen,INFOHandlers);
      if (-1 < this->MinorVersion) {
        DVar3 = (DVar3 - DVar4) - 0xc;
        check_list(f,0x61746473,DVar3,&chunklen);
        ParseLIST(this,f,chunklen,SdtaHandlers);
        if (this->SampleDataOffset != 0) {
          uVar1 = this->SizeSampleData;
          if ((this->SizeSampleDataLSB != uVar1) && (this->SizeSampleDataLSB != (uVar1 & 1) + uVar1)
             ) {
            this->SampleDataLSBOffset = 0;
            this->SizeSampleDataLSB = 0;
          }
          check_list(f,0x61746470,DVar3,&chunklen);
          ParseLIST(this,f,chunklen,PdtaHandlers);
          bVar2 = SFFile::FinalStructureTest(this);
          if (bVar2) {
            SFFile::CheckBags(this);
            SFFile::TranslatePercussions(this);
            return this;
          }
        }
      }
      uVar5 = __cxa_allocate_exception(1);
      __cxa_throw(uVar5,&CBadForm::typeinfo,0);
    }
  }
  return (SFFile *)0x0;
}

Assistant:

SFFile *ReadSF2(const char *filename, FileReader *f)
{
	SFFile *sf2 = NULL;
	DWORD filelen;
	DWORD chunklen;

	try
	{
		// Read RIFF sfbk header
		if (read_id(f) != ID_RIFF)
		{
			return NULL;
		}
		filelen = read_dword(f);
		if (read_id(f) != ID_sfbk)
		{
			return NULL;
		}
		filelen -= 4;

		// First chunk must be an INFO LIST
		check_list(f, ID_INFO, filelen, chunklen);

		sf2 = new SFFile(filename);

		ParseINFO(sf2, f, chunklen);
		filelen -= chunklen + 8;

		// Second chunk must be a sdta LIST
		check_list(f, ID_sdta, filelen, chunklen);
		ParseSdta(sf2, f, chunklen);

		// Third chunk must be a pdta LIST
		check_list(f, ID_pdta, filelen, chunklen);
		ParsePdta(sf2, f, chunklen);

		// There should be no more chunks. If there are, we'll just ignore them rather than reject the file.
		if (!sf2->FinalStructureTest())
		{
			throw CBadForm();
		}

		sf2->CheckBags();
		sf2->TranslatePercussions();

		return sf2;
	}
	catch (CIOErr)
	{
		Printf("Error reading %s: %s\n", filename, strerror(errno));
	}
	catch (CBadForm)
	{
		Printf("%s is corrupted.\n", filename);
	}
	catch (CBadVer)
	{
		Printf("%s is not a SoundFont version 2 file.\n", filename);
	}
	if (sf2 != NULL)
	{
		delete sf2;
	}
	return NULL;
}